

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void succeedingTestMethod_CorrectThrowWithCHECK_THROWS_(void)

{
  undefined4 *puVar1;
  int *anon_var_0;
  undefined1 local_18 [7];
  bool caught_expected;
  SimpleString failure_msg;
  
  SimpleString::SimpleString((SimpleString *)local_18,"expected to throw int\nbut threw nothing");
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 4;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

static void succeedingTestMethod_CorrectThrowWithCHECK_THROWS_()
{
    CHECK_THROWS(int, throw 4);
    TestTestingFixture::lineExecutedAfterCheck(); // LCOV_EXCL_LINE
}